

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void cs::
     foreach_helper<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,std::pair<cs_impl::any,cs_impl::any>>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end3;
  iterator __begin3;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range3;
  pair<cs_impl::any,_cs_impl::any> *it;
  const_iterator __end0;
  const_iterator __begin0;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *__range2;
  scope_guard scope;
  _Self *in_stack_fffffffffffffe38;
  process_context *in_stack_fffffffffffffe40;
  pair<const_cs_impl::any,_cs_impl::any> *in_stack_fffffffffffffe48;
  pair<cs_impl::any,_cs_impl::any> *in_stack_fffffffffffffe50;
  any *in_stack_fffffffffffffec0;
  var *in_stack_ffffffffffffff20;
  any *in_stack_ffffffffffffff28;
  domain_manager *in_stack_ffffffffffffff30;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_a8;
  undefined8 local_88;
  undefined1 local_78 [16];
  undefined1 *local_68;
  iterator local_60;
  iterator local_50;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_30;
  undefined8 local_20;
  
  local_20 = in_RCX;
  cs_impl::any::
  const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
            (in_stack_fffffffffffffec0);
  bVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
          ::empty((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                   *)0x2dfe2c);
  if (!bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2dfe44);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2dfe50);
    if ((peVar2->break_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2dfe66);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2dfe72);
      peVar2->break_block = false;
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2dfe86);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2dfe92);
    if ((peVar2->continue_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2dfea8);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2dfeb4);
      peVar2->continue_block = false;
    }
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffe40,(context_t *)in_stack_fffffffffffffe38);
    local_30 = cs_impl::any::
               const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                         (in_stack_fffffffffffffec0);
    local_50 = (iterator)
               phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                        *)in_stack_fffffffffffffe40);
    local_60 = (iterator)
               phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               ::end((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                      *)in_stack_fffffffffffffe40);
    while( true ) {
      bVar1 = phmap::priv::operator!=
                        ((const_iterator *)in_stack_fffffffffffffe40,
                         (const_iterator *)in_stack_fffffffffffffe38);
      if (!bVar1) break;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ::const_iterator::operator*((const_iterator *)0x2dff8c);
      std::pair<cs_impl::any,_cs_impl::any>::pair<const_cs_impl::any,_cs_impl::any,_true>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_68 = local_78;
      process_context::poll_event(in_stack_fffffffffffffe40);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2dffd5);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2dffe1);
      cs_impl::any::any<std::pair<cs_impl::any,cs_impl::any>>
                (&in_stack_fffffffffffffe50->first,
                 (pair<cs_impl::any,_cs_impl::any> *)in_stack_fffffffffffffe48);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      cs_impl::any::~any((any *)0x2e0034);
      local_88 = local_20;
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe38);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe38);
      while( true ) {
        bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        if (!bVar1) break;
        in_stack_ffffffffffffff30 =
             (domain_manager *)
             std::
             _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
             operator*(&local_a8);
        statement_base::run((statement_base *)in_stack_fffffffffffffe40);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2e03a8);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2e03b4);
        if ((peVar2->return_fcall & 1U) != 0) {
          bVar1 = true;
          goto LAB_002e0485;
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2e03d7);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2e03e3);
        if ((peVar2->break_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e03f9);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2e0405);
          peVar2->break_block = false;
          bVar1 = true;
          goto LAB_002e0485;
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2e0423);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2e042f);
        if ((peVar2->continue_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e0445);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2e0451);
          peVar2->continue_block = false;
          break;
        }
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                    *)in_stack_fffffffffffffe40);
      }
      scope_guard::clear((scope_guard *)0x2e047b);
      bVar1 = false;
LAB_002e0485:
      std::pair<cs_impl::any,_cs_impl::any>::~pair
                ((pair<cs_impl::any,_cs_impl::any> *)in_stack_fffffffffffffe40);
      if (bVar1) break;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe40);
    }
    scope_guard::~scope_guard((scope_guard *)0x2e04d6);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}